

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuidedMeshNormalFiltering.cpp
# Opt level: O1

void __thiscall
GuidedMeshNormalFiltering::getAllFaceNeighborGMNF
          (GuidedMeshNormalFiltering *this,TriMesh *mesh,FaceNeighborType face_neighbor_type,
          double radius,bool include_central_face,
          vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
          *all_face_neighbor)

{
  FaceIter FVar1;
  void *pvStack_68;
  vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> face_neighbor;
  undefined1 local_40 [8];
  FaceIter f_it;
  
  pvStack_68 = (void *)0x0;
  face_neighbor.super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  face_neighbor.super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _local_40 = OpenMesh::PolyConnectivity::faces_begin((PolyConnectivity *)mesh);
  while( true ) {
    FVar1 = OpenMesh::PolyConnectivity::faces_end((PolyConnectivity *)mesh);
    if ((BaseHandle)f_it.mesh_._0_4_ == FVar1.hnd_.super_BaseHandle.idx_.super_BaseHandle &&
        local_40 == (undefined1  [8])FVar1.mesh_) break;
    if (face_neighbor_type == kRadiusBased) {
      getRadiusBasedFaceNeighbor
                (this,mesh,(FaceHandle)f_it.mesh_._0_4_,radius,
                 (vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)&pvStack_68)
      ;
    }
    else if (face_neighbor_type == kVertexBased) {
      MeshDenoisingBase::getFaceNeighbor
                (&this->super_MeshDenoisingBase,mesh,(FaceHandle)f_it.mesh_._0_4_,kVertexBased,
                 (vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)&pvStack_68)
      ;
    }
    if (include_central_face) {
      if (face_neighbor.
          super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
          super__Vector_impl_data._M_start ==
          face_neighbor.
          super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<OpenMesh::FaceHandle,std::allocator<OpenMesh::FaceHandle>>::
        _M_realloc_insert<OpenMesh::FaceHandle_const&>
                  ((vector<OpenMesh::FaceHandle,std::allocator<OpenMesh::FaceHandle>> *)&pvStack_68,
                   (iterator)
                   face_neighbor.
                   super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
                   _M_impl.super__Vector_impl_data._M_start,(FaceHandle *)&f_it);
      }
      else {
        ((face_neighbor.
          super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
          super__Vector_impl_data._M_start)->super_BaseHandle).idx_ = f_it.mesh_._0_4_;
        face_neighbor.
        super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
        super__Vector_impl_data._M_start =
             face_neighbor.
             super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl
             .super__Vector_impl_data._M_start + 1;
      }
    }
    std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::operator=
              ((all_face_neighbor->
               super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + f_it.mesh_._0_4_,
               (vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)&pvStack_68);
    f_it.mesh_._0_4_ = f_it.mesh_._0_4_ + 1;
    if (f_it.mesh_._4_4_ != 0) {
      OpenMesh::Iterators::
      GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
      ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                  *)local_40);
    }
  }
  if (pvStack_68 != (void *)0x0) {
    operator_delete(pvStack_68);
  }
  return;
}

Assistant:

void GuidedMeshNormalFiltering::getAllFaceNeighborGMNF(TriMesh &mesh, MeshDenoisingBase::FaceNeighborType face_neighbor_type, double radius, bool include_central_face,
                                                       std::vector<std::vector<TriMesh::FaceHandle> > &all_face_neighbor)
{
    std::vector<TriMesh::FaceHandle> face_neighbor;
    for(TriMesh::FaceIter f_it = mesh.faces_begin(); f_it != mesh.faces_end(); f_it++)
    {
        if(face_neighbor_type == kVertexBased)
            getVertexBasedFaceNeighbor(mesh, *f_it, face_neighbor);
        else if(face_neighbor_type == kRadiusBased)
            getRadiusBasedFaceNeighbor(mesh, *f_it, radius, face_neighbor);

        if(include_central_face)
            face_neighbor.push_back(*f_it);
        all_face_neighbor[f_it->idx()] = face_neighbor;
    }
}